

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O0

roaring64_bitmap_t * roaring64_bitmap_from_range(uint64_t min,uint64_t max,uint64_t step)

{
  uint64_t uVar1;
  ulong in_RDX;
  uint8_t *in_RSI;
  art_key_chunk_t *in_RDI;
  uint64_t increment;
  uint64_t gap;
  leaf_t *leaf;
  uint8_t high48 [6];
  container_t *container;
  uint8_t typecode;
  uint32_t container_max;
  uint16_t container_min;
  uint64_t high_bits;
  uint64_t value;
  roaring64_bitmap_t *r;
  uint8_t *in_stack_ffffffffffffff88;
  art_val_t *in_stack_ffffffffffffff90;
  uint8_t *in_stack_ffffffffffffff98;
  leaf_t *in_stack_ffffffffffffffa0;
  uint8_t *in_stack_ffffffffffffffa8;
  art_key_chunk_t *local_30;
  art_key_chunk_t *local_10;
  roaring64_bitmap_t *local_8;
  
  if ((in_RDX == 0) || (in_RSI <= in_RDI)) {
    local_8 = (roaring64_bitmap_t *)0x0;
  }
  else {
    local_8 = roaring64_bitmap_create();
    local_30 = in_RDI;
    local_10 = in_RDI;
    if (in_RDX < 0x10000) {
      do {
        uVar1 = minimum((long)in_RSI - ((ulong)local_10 & 0xffffffffffff0000),0x10000);
        container_from_range
                  (in_stack_ffffffffffffffa8,(uint32_t)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                   (uint32_t)in_stack_ffffffffffffffa0,
                   (uint16_t)((ulong)in_stack_ffffffffffffff98 >> 0x30));
        split_key((uint64_t)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
        in_stack_ffffffffffffffa0 =
             create_leaf(in_stack_ffffffffffffff90,
                         (uint8_t)((ulong)in_stack_ffffffffffffff88 >> 0x38));
        art_insert((art_t *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                   in_stack_ffffffffffffff90);
        in_stack_ffffffffffffff88 =
             (uint8_t *)((((int)uVar1 - (uint)(ushort)local_10) + in_RDX) - 1);
        in_stack_ffffffffffffff90 =
             (art_val_t *)(in_stack_ffffffffffffff88 + -((ulong)in_stack_ffffffffffffff88 % in_RDX))
        ;
        if ((uint8_t *)(-(long)in_stack_ffffffffffffff90 - 1U) < local_10) {
          return local_8;
        }
        local_10 = in_stack_ffffffffffffff90->key + (long)local_10;
        in_stack_ffffffffffffff98 = in_stack_ffffffffffffff88;
      } while (local_10 < in_RSI);
    }
    else {
      for (; (local_30 < in_RSI &&
             (roaring64_bitmap_add
                        ((roaring64_bitmap_t *)in_stack_ffffffffffffffa0,
                         (uint64_t)in_stack_ffffffffffffff98), local_30 <= (uint8_t *)(-in_RDX - 1))
             ); local_30 = local_30 + in_RDX) {
      }
    }
  }
  return local_8;
}

Assistant:

roaring64_bitmap_t *roaring64_bitmap_from_range(uint64_t min, uint64_t max,
                                                uint64_t step) {
    if (step == 0 || max <= min) {
        return NULL;
    }
    roaring64_bitmap_t *r = roaring64_bitmap_create();
    if (step >= (1 << 16)) {
        // Only one value per container.
        for (uint64_t value = min; value < max; value += step) {
            roaring64_bitmap_add(r, value);
            if (value > UINT64_MAX - step) {
                break;
            }
        }
        return r;
    }
    do {
        uint64_t high_bits = min & 0xFFFFFFFFFFFF0000;
        uint16_t container_min = min & 0xFFFF;
        uint32_t container_max = (uint32_t)minimum(max - high_bits, 1 << 16);

        uint8_t typecode;
        container_t *container = container_from_range(
            &typecode, container_min, container_max, (uint16_t)step);

        uint8_t high48[ART_KEY_BYTES];
        split_key(min, high48);
        leaf_t *leaf = create_leaf(container, typecode);
        art_insert(&r->art, high48, (art_val_t *)leaf);

        uint64_t gap = container_max - container_min + step - 1;
        uint64_t increment = gap - (gap % step);
        if (min > UINT64_MAX - increment) {
            break;
        }
        min += increment;
    } while (min < max);
    return r;
}